

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day04a.cpp
# Opt level: O2

bool day4a::is_real_room(string *name,string *checksum)

{
  char cVar1;
  pair<char,_char> pVar2;
  pointer pcVar3;
  size_type sVar4;
  pair<char,_char> *ppVar5;
  ulong uVar6;
  size_type sVar7;
  ulong uVar8;
  long lVar9;
  pair<char,_char> *__last;
  char acStack_12a [186];
  undefined8 uStack_70;
  array<std::pair<char,_char>,_26UL> letters;
  undefined1 local_34 [12];
  
  letters._M_elems[0x10].first = '\0';
  letters._M_elems[0x10].second = '\0';
  letters._M_elems[0x11].first = '\0';
  letters._M_elems[0x11].second = '\0';
  letters._M_elems[0x12].first = '\0';
  letters._M_elems[0x12].second = '\0';
  letters._M_elems[0x13].first = '\0';
  letters._M_elems[0x13].second = '\0';
  letters._M_elems[0x14].first = '\0';
  letters._M_elems[0x14].second = '\0';
  letters._M_elems[0x15].first = '\0';
  letters._M_elems[0x15].second = '\0';
  letters._M_elems[0x16].first = '\0';
  letters._M_elems[0x16].second = '\0';
  letters._M_elems[0x17].first = '\0';
  letters._M_elems[0x17].second = '\0';
  letters._M_elems[8].first = '\0';
  letters._M_elems[8].second = '\0';
  letters._M_elems[9].first = '\0';
  letters._M_elems[9].second = '\0';
  letters._M_elems[10].first = '\0';
  letters._M_elems[10].second = '\0';
  letters._M_elems[0xb].first = '\0';
  letters._M_elems[0xb].second = '\0';
  letters._M_elems[0xc].first = '\0';
  letters._M_elems[0xc].second = '\0';
  letters._M_elems[0xd].first = '\0';
  letters._M_elems[0xd].second = '\0';
  letters._M_elems[0xe].first = '\0';
  letters._M_elems[0xe].second = '\0';
  letters._M_elems[0xf].first = '\0';
  letters._M_elems[0xf].second = '\0';
  letters._M_elems[0x18].first = '\0';
  letters._M_elems[0x18].second = '\0';
  letters._M_elems[0x19].first = '\0';
  letters._M_elems[0x19].second = '\0';
  letters._M_elems[0].first = '\0';
  letters._M_elems[0].second = '\0';
  letters._M_elems[1].first = '\0';
  letters._M_elems[1].second = '\0';
  letters._M_elems[2].first = '\0';
  letters._M_elems[2].second = '\0';
  letters._M_elems[3].first = '\0';
  letters._M_elems[3].second = '\0';
  letters._M_elems[4].first = '\0';
  letters._M_elems[4].second = '\0';
  letters._M_elems[5].first = '\0';
  letters._M_elems[5].second = '\0';
  letters._M_elems[6].first = '\0';
  letters._M_elems[6].second = '\0';
  letters._M_elems[7].first = '\0';
  letters._M_elems[7].second = '\0';
  pcVar3 = (name->_M_dataplus)._M_p;
  sVar4 = name->_M_string_length;
  for (sVar7 = 0; sVar4 != sVar7; sVar7 = sVar7 + 1) {
    cVar1 = pcVar3[sVar7];
    lVar9 = (long)cVar1;
    if (lVar9 != 0x2d) {
      acStack_12a[lVar9 * 2] = cVar1;
      acStack_12a[lVar9 * 2 + 1] = acStack_12a[lVar9 * 2 + 1] + '\x01';
    }
  }
  uStack_70 = 0x10b495;
  std::
  __introsort_loop<std::pair<char,char>*,long,__gnu_cxx::__ops::_Iter_comp_iter<day4a::is_real_room(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>>
            (&letters,local_34,8);
  uStack_70 = 0x1e;
  ppVar5 = letters._M_elems;
  for (lVar9 = 0x1e; __last = ppVar5 + 1, lVar9 != 0; lVar9 = lVar9 + -2) {
    if ((letters._M_elems[0].second < ppVar5[1].second) ||
       ((ppVar5[1].second == letters._M_elems[0].second &&
        (__last->first < letters._M_elems[0].first)))) {
      pVar2 = *__last;
      uStack_70 = 0x10b4c0;
      std::__copy_move_backward<true,false,std::random_access_iterator_tag>::
      __copy_move_b<std::pair<char,char>*,std::pair<char,char>*>(letters._M_elems,__last,ppVar5 + 2)
      ;
      letters._M_elems[0] = pVar2;
    }
    else {
      uStack_70 = 0x10b4d8;
      std::
      __unguarded_linear_insert<std::pair<char,char>*,__gnu_cxx::__ops::_Val_comp_iter<day4a::is_real_room(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>>
                (__last);
    }
    ppVar5 = __last;
  }
  uStack_70 = 0x20;
  for (lVar9 = 0x20; lVar9 != 0x34; lVar9 = lVar9 + 2) {
    uStack_70 = 0x10b4f5;
    std::
    __unguarded_linear_insert<std::pair<char,char>*,__gnu_cxx::__ops::_Val_comp_iter<day4a::is_real_room(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>>
              (&letters._M_elems[0].first + lVar9);
  }
  uVar6 = 0;
  do {
    uVar8 = uVar6;
    if (uVar8 == 5) break;
    uVar6 = uVar8 + 1;
  } while (letters._M_elems[uVar8].first == (checksum->_M_dataplus)._M_p[uVar8]);
  return 4 < uVar8;
}

Assistant:

bool is_real_room(const std::string& name, const std::string& checksum) {
		std::array<std::pair<char, char>, 26> letters;
		for(auto c : name) {
			if(c == '-') {
				continue;
			}
			auto& l = letters[c - 'a'];
			l.first = c;
			l.second++;
		}
		std::sort(letters.begin(), letters.end(), [](const auto& a, const auto& b) {
			return a.second > b.second || (a.second == b.second && a.first < b.first);
		});
		for(int i = 0; i < 5; ++i) {
			if(letters[i].first != checksum[i]) {
				return false;
			}
		}
		return true;
	}